

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::StreamingConcatenationExpressionSyntax
          (StreamingConcatenationExpressionSyntax *this,Token openBrace,Token operatorToken,
          ExpressionSyntax *sliceSize,Token innerOpenBrace,
          SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *expressions,
          Token innerCloseBrace,Token closeBrace)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar5 = operatorToken._0_8_;
  uVar6 = openBrace._0_8_;
  (this->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       StreamingConcatenationExpression;
  (this->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (this->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (this->openBrace).kind = (short)uVar6;
  (this->openBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->openBrace).info = openBrace.info;
  (this->operatorToken).kind = (short)uVar5;
  (this->operatorToken).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->operatorToken).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->operatorToken).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->operatorToken).info = operatorToken.info;
  this->sliceSize = sliceSize;
  (this->innerOpenBrace).kind = innerOpenBrace.kind;
  (this->innerOpenBrace).field_0x2 = innerOpenBrace._2_1_;
  (this->innerOpenBrace).numFlags = (NumericTokenFlags)innerOpenBrace.numFlags.raw;
  (this->innerOpenBrace).rawLen = innerOpenBrace.rawLen;
  (this->innerOpenBrace).info = innerOpenBrace.info;
  uVar3 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind =
       (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (expressions->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f9c18;
  sVar2 = (expressions->elements)._M_extent._M_extent_value;
  (this->expressions).elements._M_ptr = (expressions->elements)._M_ptr;
  (this->expressions).elements._M_extent._M_extent_value = sVar2;
  (this->innerCloseBrace).kind = innerCloseBrace.kind;
  (this->innerCloseBrace).field_0x2 = innerCloseBrace._2_1_;
  (this->innerCloseBrace).numFlags = (NumericTokenFlags)innerCloseBrace.numFlags.raw;
  (this->innerCloseBrace).rawLen = innerCloseBrace.rawLen;
  (this->innerCloseBrace).info = innerCloseBrace.info;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  if (sliceSize != (ExpressionSyntax *)0x0) {
    (sliceSize->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->expressions).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->expressions).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

StreamingConcatenationExpressionSyntax(Token openBrace, Token operatorToken, ExpressionSyntax* sliceSize, Token innerOpenBrace, const SeparatedSyntaxList<StreamExpressionSyntax>& expressions, Token innerCloseBrace, Token closeBrace) :
        PrimaryExpressionSyntax(SyntaxKind::StreamingConcatenationExpression), openBrace(openBrace), operatorToken(operatorToken), sliceSize(sliceSize), innerOpenBrace(innerOpenBrace), expressions(expressions), innerCloseBrace(innerCloseBrace), closeBrace(closeBrace) {
        if (this->sliceSize) this->sliceSize->parent = this;
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
    }